

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::AddCMakePaths(cmake *this)

{
  cmCacheManager *pcVar1;
  bool bVar2;
  string *psVar3;
  allocator local_39;
  string local_38;
  
  pcVar1 = this->CacheManager;
  std::__cxx11::string::string((string *)&local_38,"CMAKE_COMMAND",&local_39);
  psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  cmCacheManager::AddCacheEntry
            (pcVar1,&local_38,(psVar3->_M_dataplus)._M_p,"Path to CMake executable.",INTERNAL);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar1 = this->CacheManager;
  std::__cxx11::string::string((string *)&local_38,"CMAKE_CTEST_COMMAND",&local_39);
  psVar3 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  cmCacheManager::AddCacheEntry
            (pcVar1,&local_38,(psVar3->_M_dataplus)._M_p,"Path to ctest program executable.",
             INTERNAL);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar1 = this->CacheManager;
  std::__cxx11::string::string((string *)&local_38,"CMAKE_CPACK_COMMAND",&local_39);
  psVar3 = cmSystemTools::GetCPackCommand_abi_cxx11_();
  cmCacheManager::AddCacheEntry
            (pcVar1,&local_38,(psVar3->_M_dataplus)._M_p,"Path to cpack program executable.",
             INTERNAL);
  std::__cxx11::string::~string((string *)&local_38);
  psVar3 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::operator+(&local_38,psVar3,"/Modules/CMake.cmake");
  bVar2 = cmsys::SystemTools::FileExists(local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  if (!bVar2) {
    psVar3 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    cmSystemTools::Error
              ("Could not find CMAKE_ROOT !!!\nCMake has most likely not been installed correctly.\nModules directory not found in\n"
               ,(psVar3->_M_dataplus)._M_p,(char *)0x0,(char *)0x0);
  }
  else {
    pcVar1 = this->CacheManager;
    std::__cxx11::string::string((string *)&local_38,"CMAKE_ROOT",&local_39);
    psVar3 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    cmCacheManager::AddCacheEntry
              (pcVar1,&local_38,(psVar3->_M_dataplus)._M_p,"Path to CMake installation.",INTERNAL);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return (uint)bVar2;
}

Assistant:

int cmake::AddCMakePaths()
{
  // Save the value in the cache
  this->CacheManager->AddCacheEntry
    ("CMAKE_COMMAND", cmSystemTools::GetCMakeCommand().c_str(),
     "Path to CMake executable.", cmState::INTERNAL);
#ifdef CMAKE_BUILD_WITH_CMAKE
  this->CacheManager->AddCacheEntry
    ("CMAKE_CTEST_COMMAND", cmSystemTools::GetCTestCommand().c_str(),
     "Path to ctest program executable.", cmState::INTERNAL);
  this->CacheManager->AddCacheEntry
    ("CMAKE_CPACK_COMMAND", cmSystemTools::GetCPackCommand().c_str(),
     "Path to cpack program executable.", cmState::INTERNAL);
#endif
  if(!cmSystemTools::FileExists(
       (cmSystemTools::GetCMakeRoot()+"/Modules/CMake.cmake").c_str()))
    {
    // couldn't find modules
    cmSystemTools::Error("Could not find CMAKE_ROOT !!!\n"
      "CMake has most likely not been installed correctly.\n"
      "Modules directory not found in\n",
      cmSystemTools::GetCMakeRoot().c_str());
    return 0;
    }
  this->CacheManager->AddCacheEntry
    ("CMAKE_ROOT", cmSystemTools::GetCMakeRoot().c_str(),
     "Path to CMake installation.", cmState::INTERNAL);

  return 1;
}